

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer-helpers.h
# Opt level: O2

Orphan<capnp::compiler::Expression> *
capnp::_::PointerHelpers<capnp::compiler::Expression,_(capnp::Kind)3>::disown
          (PointerBuilder builder)

{
  Orphan<capnp::compiler::Expression> *in_RDI;
  OrphanBuilder local_30;
  
  PointerBuilder::disown(&local_30,(PointerBuilder *)&stack0x00000008);
  (in_RDI->builder).segment = local_30.segment;
  (in_RDI->builder).capTable = local_30.capTable;
  (in_RDI->builder).location = local_30.location;
  local_30.segment = (SegmentBuilder *)0x0;
  (in_RDI->builder).tag.content = local_30.tag.content;
  local_30.location = (word *)0x0;
  OrphanBuilder::~OrphanBuilder(&local_30);
  return in_RDI;
}

Assistant:

static inline Orphan<T> disown(PointerBuilder builder) {
    return Orphan<T>(builder.disown());
  }